

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O0

void __thiscall
t_ocaml_generator::generate_ocaml_struct_member
          (t_ocaml_generator *this,ostream *out,string *tname,t_field *tmember)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  t_type *ptVar4;
  t_const_value *ptVar5;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  t_const_value *local_e8;
  t_const_value *val;
  string local_c0;
  undefined1 local_a0 [8];
  string mname;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string x;
  t_field *tmember_local;
  string *tname_local;
  ostream *out_local;
  t_ocaml_generator *this_local;
  
  x.field_2._8_8_ = tmember;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"_x",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  psVar2 = t_field::get_name_abi_cxx11_((t_field *)x.field_2._8_8_);
  std::__cxx11::string::string((string *)&local_c0,(string *)psVar2);
  t_generator::decapitalize((string *)local_a0,(t_generator *)this,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"val mutable _");
  poVar3 = std::operator<<(poVar3,(string *)local_a0);
  poVar3 = std::operator<<(poVar3," : ");
  ptVar4 = t_field::get_type((t_field *)x.field_2._8_8_);
  render_ocaml_type_abi_cxx11_((string *)&val,this,ptVar4);
  std::operator<<(poVar3,(string *)&val);
  std::__cxx11::string::~string((string *)&val);
  local_e8 = t_field::get_value((t_field *)x.field_2._8_8_);
  if (local_e8 == (t_const_value *)0x0) {
    poVar3 = std::operator<<(out," option = None");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    bVar1 = struct_member_persistent(this,(t_field *)x.field_2._8_8_);
    if (bVar1) {
      poVar3 = std::operator<<(out," = ");
      ptVar4 = t_field::get_type((t_field *)x.field_2._8_8_);
      ptVar5 = t_field::get_value((t_field *)x.field_2._8_8_);
      render_const_value_abi_cxx11_(&local_108,this,ptVar4,ptVar5);
      poVar3 = std::operator<<(poVar3,(string *)&local_108);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_108);
    }
    else {
      poVar3 = std::operator<<(out," option = Some ");
      ptVar4 = t_field::get_type((t_field *)x.field_2._8_8_);
      ptVar5 = t_field::get_value((t_field *)x.field_2._8_8_);
      render_const_value_abi_cxx11_(&local_128,this,ptVar4,ptVar5);
      poVar3 = std::operator<<(poVar3,(string *)&local_128);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_128);
    }
  }
  bVar1 = struct_member_persistent(this,(t_field *)x.field_2._8_8_);
  if (bVar1) {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"method get_");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," = Some _");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"method grab_");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," = _");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"method set_");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    poVar3 = std::operator<<(poVar3," = _");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," <- ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"method get_");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," = _");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"method grab_");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," = match _");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," with None->raise (Field_empty \"");
    poVar3 = std::operator<<(poVar3,(string *)tname);
    poVar3 = std::operator<<(poVar3,".");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3,"\") | Some ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"method set_");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    poVar3 = std::operator<<(poVar3," = _");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," <- Some ");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"method unset_");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," = _");
    poVar3 = std::operator<<(poVar3,(string *)local_a0);
    poVar3 = std::operator<<(poVar3," <- None");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"method reset_");
  poVar3 = std::operator<<(poVar3,(string *)local_a0);
  poVar3 = std::operator<<(poVar3," = _");
  poVar3 = std::operator<<(poVar3,(string *)local_a0);
  std::operator<<(poVar3," <- ");
  if (local_e8 == (t_const_value *)0x0) {
    poVar3 = std::operator<<(out,"None");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    bVar1 = struct_member_persistent(this,(t_field *)x.field_2._8_8_);
    if (bVar1) {
      ptVar4 = t_field::get_type((t_field *)x.field_2._8_8_);
      ptVar5 = t_field::get_value((t_field *)x.field_2._8_8_);
      render_const_value_abi_cxx11_(&local_148,this,ptVar4,ptVar5);
      poVar3 = std::operator<<(out,(string *)&local_148);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_148);
    }
    else {
      poVar3 = std::operator<<(out,"Some ");
      ptVar4 = t_field::get_type((t_field *)x.field_2._8_8_);
      ptVar5 = t_field::get_value((t_field *)x.field_2._8_8_);
      render_const_value_abi_cxx11_(&local_168,this,ptVar4,ptVar5);
      poVar3 = std::operator<<(poVar3,(string *)&local_168);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_168);
    }
  }
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_member(ostream& out,
                                                     string tname,
                                                     t_field* tmember) {
  string x = tmp("_x");
  string mname = decapitalize(tmember->get_name());

  indent(out) << "val mutable _" << mname << " : " << render_ocaml_type(tmember->get_type());
  t_const_value* val = tmember->get_value();
  if (val) {
    if (struct_member_persistent(tmember))
      out << " = " << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
    else
      out << " option = Some " << render_const_value(tmember->get_type(), tmember->get_value())
          << endl;
  } else {
    // assert(!struct_member_persistent(tmember))
    out << " option = None" << endl;
  }

  if (struct_member_persistent(tmember)) {
    indent(out) << "method get_" << mname << " = Some _" << mname << endl;
    indent(out) << "method grab_" << mname << " = _" << mname << endl;
    indent(out) << "method set_" << mname << " " << x << " = _" << mname << " <- " << x << endl;
  } else {
    indent(out) << "method get_" << mname << " = _" << mname << endl;
    indent(out) << "method grab_" << mname << " = match _" << mname
                << " with None->raise (Field_empty \"" << tname << "." << mname << "\") | Some "
                << x << " -> " << x << endl;
    indent(out) << "method set_" << mname << " " << x << " = _" << mname << " <- Some " << x
                << endl;
    indent(out) << "method unset_" << mname << " = _" << mname << " <- None" << endl;
  }

  indent(out) << "method reset_" << mname << " = _" << mname << " <- ";
  if (val) {
    if (struct_member_persistent(tmember))
      out << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
    else
      out << "Some " << render_const_value(tmember->get_type(), tmember->get_value()) << endl;
  } else {
    out << "None" << endl;
  }
}